

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void __thiscall xemmai::ast::t_while::f_flow(t_while *this,t_flow *a_flow)

{
  bool bVar1;
  pointer ptVar2;
  reference this_00;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *__range2;
  t_targets targets1;
  t_targets *targets0;
  t_flow *a_flow_local;
  t_while *this_local;
  
  t_block::f_next(a_flow->v_current,&this->v_junction_condition);
  t_block::f_next(&this->v_junction_condition,&this->v_block_condition);
  a_flow->v_current = &this->v_block_condition;
  ptVar2 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
           operator->(&this->v_condition);
  (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
  t_block::f_next(a_flow->v_current,&this->v_block_block);
  t_block::f_next(a_flow->v_current,&this->v_junction_exit);
  targets1.v_return = (t_block *)a_flow->v_targets;
  __range2 = (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
              *)&this->v_junction_exit;
  targets1.v_break = &this->v_junction_condition;
  targets1.v_continue =
       (t_block *)
       ((targets1.v_return)->v_privates).
       super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
       ._M_impl.super__Vector_impl_data._M_start;
  a_flow->v_targets = (t_targets *)&__range2;
  a_flow->v_current = &this->v_block_block;
  __end2 = std::
           vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ::begin(&this->v_block);
  p = (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
      ::end(&this->v_block);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                      (&__end2,(__normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                                *)&p);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
              ::operator*(&__end2);
    ptVar2 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(this_00);
    (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
    ::operator++(&__end2);
  }
  a_flow->v_targets = (t_targets *)targets1.v_return;
  t_block::f_next(a_flow->v_current,&this->v_junction_condition);
  t_block::f_next(&this->v_junction_exit,&this->v_block_exit);
  a_flow->v_current = &this->v_block_exit;
  return;
}

Assistant:

void t_while::f_flow(t_flow& a_flow)
{
	a_flow.v_current->f_next(&v_junction_condition);
	v_junction_condition.f_next(&v_block_condition);
	a_flow.v_current = &v_block_condition;
	v_condition->f_flow(a_flow);
	a_flow.v_current->f_next(&v_block_block);
	a_flow.v_current->f_next(&v_junction_exit);
	auto targets0 = a_flow.v_targets;
	t_flow::t_targets targets1{&v_junction_exit, &v_junction_condition, targets0->v_return};
	a_flow.v_targets = &targets1;
	a_flow.v_current = &v_block_block;
	for (auto& p : v_block) p->f_flow(a_flow);
	a_flow.v_targets = targets0;
	a_flow.v_current->f_next(&v_junction_condition);
	v_junction_exit.f_next(&v_block_exit);
	a_flow.v_current = &v_block_exit;
}